

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.h
# Opt level: O0

unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
__thiscall wabt::WastLexer::MakeLineFinder(WastLexer *this)

{
  pointer pLVar1;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *in_RSI;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> local_20 [2];
  WastLexer *this_local;
  
  this_local = this;
  pLVar1 = std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::operator->
                     (in_RSI);
  (*pLVar1->_vptr_LexerSource[2])();
  MakeUnique<wabt::LexerSourceLineFinder,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>>
            ((wabt *)this,local_20);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr(local_20)
  ;
  return (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
          )(__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<LexerSourceLineFinder> MakeLineFinder() {
    return MakeUnique<LexerSourceLineFinder>(source_->Clone());
  }